

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O2

IntrinsicResult MiniScript::intrinsic_hasIndex(Context *context,IntrinsicResult partialResult)

{
  bool bVar1;
  int32_t iVar2;
  ulong uVar3;
  long lVar4;
  Value *this;
  long lVar5;
  ValueList list;
  Value index;
  Value self;
  Value local_90;
  Value local_80;
  Value local_70;
  Value local_60;
  Value local_50;
  String local_40;
  String local_30;
  
  String::String(&local_30,"self");
  Context::GetVar((Context *)&self,(String *)partialResult.rs,(LocalOnlyMode)&local_30);
  String::~String(&local_30);
  String::String(&local_40,"index");
  Context::GetVar((Context *)&index,(String *)partialResult.rs,(LocalOnlyMode)&local_40);
  String::~String(&local_40);
  if (self.type == String) {
    if (index.type == Number) {
      Value::GetString((Value *)&list);
      iVar2 = Value::IntValue(&index);
      lVar4 = String::Length((String *)&list);
      lVar5 = (long)iVar2;
      if (SBORROW8(lVar5,-lVar4) == lVar5 + lVar4 < 0) {
        lVar4 = String::Length((String *)&list);
        bVar1 = lVar5 < lVar4;
      }
      else {
        bVar1 = false;
      }
      Value::Truth(&local_70,bVar1);
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_70,true);
      Value::~Value(&local_70);
      String::~String((String *)&list);
      goto LAB_00121451;
    }
    Value::Value(&local_80,(Value *)Value::zero);
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_80,true);
    this = &local_80;
LAB_001213d0:
    Value::~Value(this);
    goto LAB_00121451;
  }
  if (self.type == Map) {
    Value::GetDict((ValueDict *)&list,&self);
    bVar1 = Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::ContainsKey
                      ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)
                       &list,&index);
    Value::Truth(&local_90,bVar1);
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_90,true);
    Value::~Value(&local_90);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)&list);
    goto LAB_00121451;
  }
  if (self.type != List) {
    IntrinsicResult::IntrinsicResult
              ((IntrinsicResult *)context,(IntrinsicResult *)&IntrinsicResult::Null);
    goto LAB_00121451;
  }
  if (index.type != Number) {
    Value::Value(&local_60,(Value *)Value::zero);
    IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_60,true);
    this = &local_60;
    goto LAB_001213d0;
  }
  Value::GetList((Value *)&list);
  iVar2 = Value::IntValue(&index);
  lVar4 = (long)iVar2;
  if (list.ls == (ListStorage<MiniScript::Value> *)0x0) {
    uVar3 = 0;
    if (-1 < iVar2) goto LAB_0012141c;
  }
  else {
    uVar3 = ((list.ls)->super_SimpleVector<MiniScript::Value>).mQtyItems;
    if (SBORROW8(lVar4,-uVar3) == (long)(lVar4 + uVar3) < 0) {
LAB_0012141c:
      uVar3 = (ulong)(lVar4 < (long)uVar3);
    }
    else {
      uVar3 = 0;
    }
  }
  Value::Truth(&local_50,SUB81(uVar3,0));
  IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_50,true);
  Value::~Value(&local_50);
  List<MiniScript::Value>::release(&list);
LAB_00121451:
  Value::~Value(&index);
  Value::~Value(&self);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_hasIndex(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		Value index = context->GetVar("index");
		if (self.type == ValueType::List) {
			if (index.type == ValueType::Number) {
				ValueList list = self.GetList();
				long i = index.IntValue();
				return IntrinsicResult(Value::Truth(i >= -list.Count() and i < list.Count()));
			}
			return IntrinsicResult(Value::zero);
		} else if (self.type == ValueType::String) {
			if (index.type == ValueType::Number) {
				String str = self.GetString();
				long i = index.IntValue();
				return IntrinsicResult(Value::Truth(i >= -str.Length() and i < str.Length()));
			}
			return IntrinsicResult(Value::zero);
		} else if (self.type == ValueType::Map) {
			ValueDict map = self.GetDict();
			return IntrinsicResult(Value::Truth(map.ContainsKey(index)));
		}
		return IntrinsicResult::Null;
	}